

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O2

ssize_t ngx_parse_size(ngx_str_t *line)

{
  u_char uVar1;
  ssize_t sVar2;
  long lVar3;
  size_t n;
  long lVar4;
  long lVar5;
  
  n = line->len;
  lVar3 = -1;
  if (n == 0) {
    return -1;
  }
  uVar1 = line->data[n - 1];
  if (uVar1 != 'K') {
    if ((uVar1 == 'M') || (uVar1 == 'm')) {
      n = n - 1;
      lVar5 = 0x7ffffffffff;
      lVar4 = 0x100000;
      goto LAB_00117d2e;
    }
    if (uVar1 != 'k') {
      lVar5 = 0x7fffffffffffffff;
      lVar4 = 1;
      goto LAB_00117d2e;
    }
  }
  n = n - 1;
  lVar5 = 0x1fffffffffffff;
  lVar4 = 0x400;
LAB_00117d2e:
  sVar2 = ngx_atosz(line->data,n);
  if (sVar2 <= lVar5 && sVar2 != -1) {
    lVar3 = sVar2 * lVar4;
  }
  return lVar3;
}

Assistant:

ssize_t
ngx_parse_size(ngx_str_t *line)
{
    u_char   unit;
    size_t   len;
    ssize_t  size, scale, max;

    len = line->len;

    if (len == 0) {
        return NGX_ERROR;
    }

    unit = line->data[len - 1];

    switch (unit) {
    case 'K':
    case 'k':
        len--;
        max = NGX_MAX_SIZE_T_VALUE / 1024;
        scale = 1024;
        break;

    case 'M':
    case 'm':
        len--;
        max = NGX_MAX_SIZE_T_VALUE / (1024 * 1024);
        scale = 1024 * 1024;
        break;

    default:
        max = NGX_MAX_SIZE_T_VALUE;
        scale = 1;
    }

    size = ngx_atosz(line->data, len);
    if (size == NGX_ERROR || size > max) {
        return NGX_ERROR;
    }

    size *= scale;

    return size;
}